

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O0

int mcpl2phits_app_usage(char **argv,char *errmsg)

{
  void *__ptr;
  long in_RSI;
  undefined8 *in_RDI;
  char *progname;
  uint local_4;
  
  if (in_RSI == 0) {
    __ptr = (void *)mcpl_usage_progname(*in_RDI);
    printf("Usage:\n\n");
    printf("  %s [options] <input.mcpl> [phits.dmp]\n\n",__ptr);
    printf(
          "Converts the Monte Carlo particles in the input MCPL file to binary PHITS\ndump file format and stores the result in the designated output file\n(defaults to \"phitsdata_dmp\"). The file can be read in PHITS using\na configuration of (assuming the filename is \"phits.dmp\"):\n     dump = 13\n     1 2 3 4 5 6 7 8 9 10 14 15 16\n     file = phits.dmp\n\nOptions:\n\n  -h, --help   : Show this usage information.\n  -n, --nopol  : Do not write polarisation info (saving ~22%% in file size). The\n                 PHITS configuration reading the file must then be (assuming the\n                 filename is \"phits.dmp\"):\n                                            dump = 10\n                                            1 2 3 4 5 6 7 8 9 10\n                                            file = phits.dmp\n  -f           : Write Fortran records with 64 bit integer markers. Note that\n                 the default (32 bit) is almost always the correct choice.\n  -l<LIMIT>    : Limit the number of particles transferred to the PHITS file\n                 (defaults to 0, meaning no limit).\n"
          );
    free(__ptr);
  }
  else {
    printf("ERROR: %s\n\n",in_RSI);
    printf("Run with -h or --help for usage information\n");
  }
  local_4 = (uint)(in_RSI != 0);
  return local_4;
}

Assistant:

int mcpl2phits_app_usage( const char** argv, const char * errmsg ) {
  if (errmsg) {
    printf("ERROR: %s\n\n",errmsg);
    printf("Run with -h or --help for usage information\n");
    return 1;
  }
  char * progname = mcpl_usage_progname(argv[0]);
  printf("Usage:\n\n");
  printf("  %s [options] <input.mcpl> [phits.dmp]\n\n",progname);
  printf("Converts the Monte Carlo particles in the input MCPL file to binary PHITS\n"
         "dump file format and stores the result in the designated output file\n"
         "(defaults to \"phitsdata_dmp\"). The file can be read in PHITS using\n"
         "a configuration of (assuming the filename is \"phits.dmp\"):\n"
         "     dump = 13\n"
         "     1 2 3 4 5 6 7 8 9 10 14 15 16\n"
         "     file = phits.dmp\n"
         "\n"
         "Options:\n"
         "\n"
         "  -h, --help   : Show this usage information.\n"
         "  -n, --nopol  : Do not write polarisation info (saving ~22%% in file size). The\n"
         "                 PHITS configuration reading the file must then be (assuming the\n"
         "                 filename is \"phits.dmp\"):\n"
         "                                            dump = 10\n"
         "                                            1 2 3 4 5 6 7 8 9 10\n"
         "                                            file = phits.dmp\n"
         "  -f           : Write Fortran records with 64 bit integer markers. Note that\n"
         "                 the default (32 bit) is almost always the correct choice.\n"
         "  -l<LIMIT>    : Limit the number of particles transferred to the PHITS file\n"
         "                 (defaults to 0, meaning no limit).\n"
         );
  free(progname);
  return 0;
}